

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::sethdseed(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff6a8;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff6b0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e0;
  UniValue *in_stack_fffffffffffff6e8;
  iterator in_stack_fffffffffffff6f0;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  Fallback *in_stack_fffffffffffff708;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff710;
  string *in_stack_fffffffffffff718;
  RPCArg *in_stack_fffffffffffff720;
  RPCResults *in_stack_fffffffffffff728;
  RPCResult *in_stack_fffffffffffff730;
  _Alloc_hider in_stack_fffffffffffff7f0;
  RPCResults *in_stack_fffffffffffff7f8;
  undefined8 in_stack_fffffffffffff800;
  undefined8 in_stack_fffffffffffff808;
  string *in_stack_fffffffffffff810;
  pointer this_00;
  allocator<char> local_7ca;
  allocator<char> local_7c9 [27];
  allocator<char> local_7ae;
  allocator<char> local_7ad;
  allocator<char> local_7ac;
  allocator<char> local_7ab [2];
  allocator<char> local_7a9 [32];
  allocator<char> local_789 [153];
  RPCMethodImpl *in_stack_fffffffffffff910;
  undefined1 local_278 [528];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::operator+(&in_stack_fffffffffffff6f8->skip_type_check,&in_stack_fffffffffffff6f0->m_names);
  std::operator+(in_stack_fffffffffffff6c0,(char *)in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  local_7ab[1] = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff6e8,(bool *)in_stack_fffffffffffff6e0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::__cxx11::string::string(in_stack_fffffffffffff6c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6a8);
  RPCArg::RPCArg(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (Type)((ulong)in_stack_fffffffffffff710 >> 0x20),in_stack_fffffffffffff708,
                 in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::__cxx11::string::string(in_stack_fffffffffffff6c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6a8);
  RPCArg::RPCArg(in_stack_fffffffffffff720,in_stack_fffffffffffff718,
                 (Type)((ulong)in_stack_fffffffffffff710 >> 0x20),in_stack_fffffffffffff708,
                 in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff708 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff6a8);
  __l._M_len = (size_type)in_stack_fffffffffffff6f8;
  __l._M_array = in_stack_fffffffffffff6f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6e8,__l,
             (allocator_type *)in_stack_fffffffffffff6e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  this_00 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6a8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff730,(Type)((ulong)in_stack_fffffffffffff728 >> 0x20),
             &in_stack_fffffffffffff720->m_names,in_stack_fffffffffffff718,in_stack_fffffffffffff710
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff728,(RPCResult *)in_stack_fffffffffffff720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  HelpExampleCli(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  HelpExampleCli(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::operator+(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  HelpExampleCli(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::operator+(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8,(char *)in_stack_fffffffffffff6f0,
             (allocator<char> *)in_stack_fffffffffffff6e8);
  HelpExampleRpc(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  std::operator+(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff6a8,(string *)0x9e45cd);
  this = (RPCArg *)&stack0xfffffffffffff7f0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::sethdseed()::__0,void>
            (in_stack_fffffffffffff6b8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff6b0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)this_00,in_stack_fffffffffffff810,(string *)in_stack_fffffffffffff808,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff800,
             in_stack_fffffffffffff7f8,(RPCExamples *)in_stack_fffffffffffff7f0._M_p,
             in_stack_fffffffffffff910);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff810);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff811);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff812);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff813);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff814);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff815);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff816);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff817);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7c9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_278;
  puVar1 = local_68;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ae);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ad);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7ac);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7ab);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_7a9);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_789);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan sethdseed()
{
    return RPCHelpMan{"sethdseed",
                "\nSet or generate a new HD wallet seed. Non-HD wallets will not be upgraded to being a HD wallet. Wallets that are already\n"
                "HD will have a new HD seed set so that new keys added to the keypool will be derived from this new seed.\n"
                "\nNote that you will need to MAKE A NEW BACKUP of your wallet after setting the HD wallet seed." + HELP_REQUIRING_PASSPHRASE +
                "Note: This command is only compatible with legacy wallets.\n",
                {
                    {"newkeypool", RPCArg::Type::BOOL, RPCArg::Default{true}, "Whether to flush old unused addresses, including change addresses, from the keypool and regenerate it.\n"
                                         "If true, the next address from getnewaddress and change address from getrawchangeaddress will be from this new seed.\n"
                                         "If false, addresses (including change addresses if the wallet already had HD Chain Split enabled) from the existing\n"
                                         "keypool will be used until it has been depleted."},
                    {"seed", RPCArg::Type::STR, RPCArg::DefaultHint{"random seed"}, "The WIF private key to use as the new HD seed.\n"
                                         "The seed value can be retrieved using the dumpwallet command. It is the private key marked hdseed=1"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("sethdseed", "")
            + HelpExampleCli("sethdseed", "false")
            + HelpExampleCli("sethdseed", "true \"wifkey\"")
            + HelpExampleRpc("sethdseed", "true, \"wifkey\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LegacyScriptPubKeyMan& spk_man = EnsureLegacyScriptPubKeyMan(*pwallet, true);

    if (pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Cannot set a HD seed to a wallet with private keys disabled");
    }

    LOCK2(pwallet->cs_wallet, spk_man.cs_KeyStore);

    // Do not do anything to non-HD wallets
    if (!pwallet->CanSupportFeature(FEATURE_HD)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Cannot set an HD seed on a non-HD wallet. Use the upgradewallet RPC in order to upgrade a non-HD wallet to HD");
    }

    EnsureWalletIsUnlocked(*pwallet);

    bool flush_key_pool = true;
    if (!request.params[0].isNull()) {
        flush_key_pool = request.params[0].get_bool();
    }

    CPubKey master_pub_key;
    if (request.params[1].isNull()) {
        master_pub_key = spk_man.GenerateNewSeed();
    } else {
        CKey key = DecodeSecret(request.params[1].get_str());
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key");
        }

        if (HaveKey(spk_man, key)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Already have this key (either as an HD seed or as a loose private key)");
        }

        master_pub_key = spk_man.DeriveNewSeed(key);
    }

    spk_man.SetHDSeed(master_pub_key);
    if (flush_key_pool) spk_man.NewKeyPool();

    return UniValue::VNULL;
},
    };
}